

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O3

int parsedate(char *date,time_t *output)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  byte bVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  byte *__nptr;
  ulong max;
  int iVar18;
  int iVar19;
  char **ppcVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  char *end;
  int local_70;
  uint local_6c;
  byte *local_38;
  
  bVar14 = *date;
  iVar12 = -1;
  local_6c = 0xffffffff;
  uVar17 = 0xffffffff;
  iVar19 = -1;
  local_70 = -1;
  iVar16 = -1;
  iVar18 = -1;
  if (bVar14 != 0) {
    lVar13 = 0xffffffff;
    bVar2 = false;
    local_70 = -1;
    iVar19 = -1;
    local_6c = 0xffffffff;
    pbVar10 = (byte *)date;
    iVar4 = iVar12;
    uVar9 = 0;
    do {
      bVar8 = bVar14 & 0xdf;
      __nptr = pbVar10;
      if ((byte)(bVar8 + 0xa5) < 0xe6 && (byte)(bVar14 - 0x3a) < 0xf6) {
        do {
          bVar14 = __nptr[1];
          __nptr = __nptr + 1;
          bVar8 = bVar14 & 0xdf;
          if ((0xe5 < (byte)(bVar8 + 0xa5)) || (bVar14 == 0)) break;
        } while ((byte)(bVar14 - 0x3a) < 0xf6);
      }
      iVar12 = iVar4;
      if ((byte)(bVar8 + 0xbf) < 0x1a) {
        for (max = 0; (((byte)(bVar14 + 0x9f) < 0x1a || (('@' < (char)bVar14 && (bVar14 < 0x5b))))
                      && (max < 0xc)); max = max + 1) {
          bVar14 = __nptr[max + 1];
        }
        if (max == 0xc) goto LAB_00147ee9;
        if ((int)lVar13 == -1) {
          ppcVar20 = weekday;
          if (max < 4) {
            lVar13 = 0xffffffff;
            ppcVar20 = Curl_wkday;
            if (max != 3) goto LAB_00147a28;
          }
          lVar13 = 0;
          do {
            __s = ppcVar20[lVar13];
            sVar6 = strlen(__s);
            if ((sVar6 == max) && (iVar4 = curl_strnequal((char *)__nptr,__s,max), iVar4 != 0))
            goto LAB_00147aef;
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 != 7);
          lVar13 = 0xffffffff;
        }
LAB_00147a28:
        if ((iVar18 == -1) && (iVar18 = -1, max == 3)) {
          iVar18 = 0;
          ppcVar20 = Curl_month;
          do {
            iVar4 = curl_strnequal((char *)__nptr,*ppcVar20,3);
            if (iVar4 != 0) goto LAB_00147aef;
            ppcVar20 = ppcVar20 + 1;
            iVar18 = iVar18 + 1;
          } while (iVar18 != 0xc);
          iVar18 = -1;
        }
        if ((local_70 != -1) || (4 < max)) goto LAB_00147ee9;
        lVar21 = 0;
        while( true ) {
          sVar6 = strlen(tz[0].name + lVar21);
          if ((sVar6 == max) &&
             (iVar4 = curl_strnequal((char *)__nptr,tz[0].name + lVar21,max), iVar4 != 0)) break;
          lVar21 = lVar21 + 0xc;
          if ((int)lVar21 == 0x33c) goto LAB_00147ee9;
        }
        local_70 = *(int *)(tz[0].name + lVar21 + 8) * 0x3c;
LAB_00147aef:
        pbVar10 = __nptr + max;
      }
      else {
        pbVar10 = __nptr;
        if ((byte)(bVar14 - 0x30) < 10) {
          if (uVar17 == 0xffffffff) {
            bVar23 = 9 < (byte)(__nptr[1] - 0x30);
            pbVar10 = __nptr + 2;
            if (bVar23) {
              pbVar10 = __nptr + 1;
            }
            iVar12 = (__nptr[1] - 0x210) + ((uint)bVar14 + (uint)bVar14 * 4) * 2;
            if (bVar23) {
              iVar12 = bVar14 - 0x30;
            }
            if (((iVar12 < 0x18) && (*pbVar10 == 0x3a)) && ((byte)(pbVar10[1] - 0x30) < 10)) {
              uVar11 = pbVar10[1] - 0x30;
              bVar14 = pbVar10[2];
              if ((byte)(bVar14 - 0x30) < 10) {
                uVar11 = ((uint)bVar14 + uVar11 * 10) - 0x30;
                if (0x3b < uVar11) goto LAB_00147b70;
                bVar14 = pbVar10[3];
                pbVar10 = pbVar10 + 3;
              }
              else {
                pbVar10 = pbVar10 + 2;
              }
              if ((bVar14 == 0x3a) && ((byte)(pbVar10[1] - 0x30) < 10)) {
                uVar15 = pbVar10[1] - 0x30;
                if ((byte)(pbVar10[2] - 0x30) < 10) {
                  uVar15 = ((uint)pbVar10[2] + uVar15 * 10) - 0x30;
                  if (0x3c < uVar15) goto LAB_00147b70;
                  pbVar10 = pbVar10 + 3;
                  uVar17 = uVar15;
                  local_6c = uVar11;
                }
                else {
                  pbVar10 = pbVar10 + 2;
                  uVar17 = uVar15;
                  local_6c = uVar11;
                }
              }
              else {
                uVar17 = 0;
                local_6c = uVar11;
              }
              goto LAB_00147daa;
            }
          }
LAB_00147b70:
          piVar7 = __errno_location();
          iVar12 = *piVar7;
          *piVar7 = 0;
          lVar21 = strtol((char *)__nptr,(char **)&local_38,10);
          iVar5 = *piVar7;
          if (iVar5 != iVar12) {
            *piVar7 = iVar12;
          }
          if ((iVar5 != 0) || (lVar21 - 0x80000000U < 0xffffffff00000000)) goto LAB_00147ee9;
          iVar5 = curlx_sltosi(lVar21);
          lVar21 = (long)local_38 - (long)__nptr;
          if (local_70 == -1) {
            local_70 = -1;
            bVar23 = false;
            if (((date < __nptr) && (bVar23 = false, lVar21 == 4)) && (iVar5 < 0x579)) {
              bVar14 = __nptr[-1];
              lVar21 = 4;
              if ((bVar14 != 0x2d) && (bVar14 != 0x2b)) goto LAB_00147bf1;
              iVar12 = iVar5 + (iVar5 / 100) * -0x28;
              local_70 = iVar12 * -0x3c;
              if (bVar14 != 0x2b) {
                local_70 = iVar12 * 0x3c;
              }
              bVar23 = true;
            }
          }
          else {
LAB_00147bf1:
            bVar23 = false;
          }
          iVar12 = iVar16;
          if (((lVar21 == 8) && (iVar19 == -1)) && ((iVar18 == -1 && (iVar16 == -1)))) {
            iVar19 = iVar5 / 10000;
            iVar18 = (int)(short)((short)((short)iVar5 + (short)iVar19 * -10000) / 100 + -1);
            iVar12 = iVar5 % 100;
            bVar23 = true;
          }
          bVar1 = (bool)(iVar12 == -1 & !bVar2 & ~bVar23);
          bVar22 = iVar5 - 1U < 0x1f;
          iVar16 = -1;
          if (bVar22) {
            iVar16 = iVar5;
          }
          bVar3 = true;
          if (!bVar1) {
            iVar16 = iVar12;
            bVar3 = bVar2;
          }
          bVar22 = (bool)(bVar22 & bVar1);
          pbVar10 = local_38;
          if (((bVar22 || bVar23) || (!bVar3)) || (iVar19 != -1)) {
            iVar12 = iVar4;
            bVar2 = bVar3;
            if (!bVar22 && !bVar23) goto LAB_00147ee9;
          }
          else {
            if (iVar5 < 100) {
              if (iVar5 < 0x47) {
                iVar5 = iVar5 + 2000;
              }
              else {
                iVar5 = iVar5 + 0x76c;
              }
            }
            iVar12 = iVar4;
            iVar19 = iVar5;
            bVar2 = iVar16 != -1;
          }
        }
      }
LAB_00147daa:
      bVar14 = *pbVar10;
    } while ((bVar14 != 0) && (bVar23 = uVar9 < 5, iVar4 = iVar12, uVar9 = uVar9 + 1, bVar23));
  }
  if (uVar17 == 0xffffffff) {
    iVar12 = 0;
    local_6c = 0;
    uVar17 = 0;
  }
  if (iVar16 == -1) {
LAB_00147ee9:
    iVar4 = -1;
  }
  else {
    iVar4 = -1;
    if (((iVar18 != -1) && (0x62e < iVar19)) &&
       ((iVar16 < 0x20 &&
        ((((iVar18 < 0xc && (iVar12 < 0x18)) && ((int)local_6c < 0x3c)) && ((int)uVar17 < 0x3d))))))
    {
      uVar9 = iVar19 - (uint)(iVar18 < 2);
      iVar4 = 0;
      if (local_70 == -1) {
        local_70 = 0;
      }
      *output = (long)local_70 + (long)(int)uVar17 +
                ((long)(int)local_6c +
                ((long)iVar12 +
                ((long)iVar16 + (long)(iVar19 + -0x7b2) * 0x16d +
                 (long)*(int *)(time2epoch_month_days_cumulative + (long)iVar18 * 4) +
                (long)(int)(uVar9 / 400 + ((uVar9 >> 2) - uVar9 / 100) + -0x1dd)) * 0x18) * 0x3c) *
                0x3c + -0x15180;
    }
  }
  return iVar4;
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      size_t len = 0;
      const char *p = date;
      while(ISALPHA(*p) && (len < NAME_LEN)) {
        p++;
        len++;
      }

      if(len != NAME_LEN) {
        if(wdaynum == -1) {
          wdaynum = checkday(date, len);
          if(wdaynum != -1)
            found = TRUE;
        }
        if(!found && (monnum == -1)) {
          monnum = checkmonth(date, len);
          if(monnum != -1)
            found = TRUE;
        }

        if(!found && (tzoff == -1)) {
          /* this just must be a time zone string */
          tzoff = checktz(date, len);
          if(tzoff != -1)
            found = TRUE;
        }
      }
      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      if((secnum == -1) &&
         match_time(date, &hournum, &minnum, &secnum, &end)) {
        /* time stamp */
        date = end;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate < date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication. 1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+' ? -tzoff : tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val < 32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32-bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32-bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature a 64 bits 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}